

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGGeometryElement::updateMarkerPositions
          (SVGGeometryElement *this,SVGMarkerPositionList *positions,SVGLayoutState *state)

{
  bool bVar1;
  PathCommand PVar2;
  SVGMarkerElement *pSVar3;
  SVGMarkerElement *pSVar4;
  SVGMarkerElement **__args;
  int iVar5;
  uint uVar6;
  float fVar7;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar8 [16];
  float angle;
  SVGMarkerElement *markerStart;
  array<lunasvg::Point,_3UL> points;
  PathIterator it;
  SVGMarkerElement *markerMid;
  SVGMarkerElement *markerEnd;
  Point local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  SVGMarkerElement *local_c0;
  array<lunasvg::Point,_3UL> local_b8;
  vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>> *local_a0;
  PathIterator local_98;
  SVGMarkerElement *local_88;
  float local_80;
  float local_7c;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  SVGMarkerElement *local_60;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  
  local_a0 = (vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>> *)
             positions;
  bVar1 = Path::isEmpty(&this->m_path);
  if (!bVar1) {
    local_b8._M_elems[1] = (Point)(state->m_marker_start)._M_dataplus._M_p;
    local_b8._M_elems[0] = (Point)(state->m_marker_start)._M_string_length;
    pSVar3 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_b8);
    local_b8._M_elems[1] = (Point)(state->m_marker_mid)._M_dataplus._M_p;
    local_b8._M_elems[0] = (Point)(state->m_marker_mid)._M_string_length;
    local_c0 = pSVar3;
    pSVar4 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_b8);
    local_b8._M_elems[1] = (Point)(state->m_marker_end)._M_dataplus._M_p;
    local_b8._M_elems[0] = (Point)(state->m_marker_end)._M_string_length;
    local_88 = pSVar4;
    local_60 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_b8);
    if (((local_60 != (SVGMarkerElement *)0x0) || (pSVar3 != (SVGMarkerElement *)0x0)) ||
       (pSVar4 != (SVGMarkerElement *)0x0)) {
      iVar5 = 0;
      local_d8.x = 0.0;
      local_d8.y = 0.0;
      local_b8._M_elems[2].x = 0.0;
      local_b8._M_elems[2].y = 0.0;
      local_58 = 0.0;
      fStack_54 = 0.0;
      uStack_50 = 0;
      local_b8._M_elems[0].x = 0.0;
      local_b8._M_elems[0].y = 0.0;
      local_b8._M_elems[1].x = 0.0;
      local_b8._M_elems[1].y = 0.0;
      PathIterator::PathIterator(&local_98,&this->m_path);
      if (local_98.m_index < local_98.m_size) {
        local_c8 = 0.0;
        local_cc = 0.0;
        local_78 = 0.0;
        fStack_74 = 0.0;
        uStack_70 = 0;
        do {
          PVar2 = PathIterator::currentSegment(&local_98,&local_b8);
          switch(PVar2) {
          case MoveTo:
            local_c8 = local_d8.x;
            local_cc = local_d8.y;
            local_d8.x = local_b8._M_elems[0].x;
            local_d8.y = local_b8._M_elems[0].y;
            local_58 = local_b8._M_elems[0].x;
            fStack_54 = local_b8._M_elems[0].y;
            uStack_50 = 0;
            local_78 = local_b8._M_elems[0].x;
            fStack_74 = local_b8._M_elems[0].y;
            uStack_70 = 0;
            break;
          case LineTo:
            local_c8 = local_d8.x;
            local_cc = local_d8.y;
            local_d8.x = local_b8._M_elems[0].x;
            local_d8.y = local_b8._M_elems[0].y;
            goto LAB_0011375b;
          case CubicTo:
            local_c8 = local_b8._M_elems[1].x;
            local_cc = local_b8._M_elems[1].y;
            local_d8.x = local_b8._M_elems[2].x;
            local_d8.y = local_b8._M_elems[2].y;
LAB_0011375b:
            uStack_70 = 0;
            local_78 = local_d8.x;
            fStack_74 = local_d8.y;
            break;
          case Close:
            local_c8 = local_d8.x;
            local_cc = local_d8.y;
            local_78 = local_b8._M_elems[0].x;
            fStack_74 = local_b8._M_elems[0].y;
            uStack_70 = 0;
            local_d8.x = local_58;
            local_d8.y = fStack_54;
            local_58 = 0.0;
            fStack_54 = 0.0;
            uStack_50 = 0;
          }
          PathIterator::next(&local_98);
          if ((local_98.m_index < local_98.m_size) &&
             (local_88 != (SVGMarkerElement *)0x0 || local_c0 != (SVGMarkerElement *)0x0)) {
            PathIterator::currentSegment(&local_98,&local_b8);
            if ((iVar5 == 0) && (local_c0 != (SVGMarkerElement *)0x0)) {
              fVar7 = atan2f(local_b8._M_elems[0].y - local_d8.y,local_b8._M_elems[0].x - local_d8.x
                            );
              local_c4 = (fVar7 * 180.0) / 3.1415927;
              if ((local_c0->m_orient).m_orientType == AutoStartReverse) {
                local_c4 = local_c4 + -180.0;
              }
              __args = &local_c0;
            }
            else {
              if ((iVar5 == 0) || (local_88 == (SVGMarkerElement *)0x0)) goto LAB_001138e6;
              local_7c = local_b8._M_elems[0].x - local_d8.x;
              local_80 = local_b8._M_elems[0].y - local_d8.y;
              local_48 = atan2f(fStack_74 - local_cc,local_78 - local_c8);
              fStack_44 = extraout_XMM0_Db;
              fVar7 = atan2f(local_80,local_7c);
              auVar8._0_4_ = local_48 * 180.0;
              auVar8._4_4_ = fVar7 * 180.0;
              auVar8._8_4_ = fStack_44 * 0.0;
              auVar8._12_4_ = extraout_XMM0_Db_00 * 0.0;
              auVar8 = divps(auVar8,_DAT_001438b0);
              fVar7 = auVar8._0_4_;
              uVar6 = -(uint)(180.0 < ABS(fVar7 - auVar8._4_4_));
              local_c4 = ((float)(~uVar6 & (uint)fVar7 | (uint)(fVar7 + 360.0) & uVar6) +
                         auVar8._4_4_) * 0.5;
              __args = &local_88;
            }
            std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
            emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                      (local_a0,__args,&local_d8,&local_c4);
          }
LAB_001138e6:
          if (local_98.m_size <= local_98.m_index && local_60 != (SVGMarkerElement *)0x0) {
            fVar7 = atan2f(fStack_74 - local_cc,local_78 - local_c8);
            local_c4 = (fVar7 * 180.0) / 3.1415927;
            std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
            emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                      (local_a0,&local_60,&local_d8,&local_c4);
          }
          iVar5 = iVar5 + -1;
        } while (local_98.m_index < local_98.m_size);
      }
    }
  }
  return;
}

Assistant:

void SVGGeometryElement::updateMarkerPositions(SVGMarkerPositionList& positions, const SVGLayoutState& state)
{
    if(m_path.isEmpty())
        return;
    auto markerStart = getMarker(state.marker_start());
    auto markerMid = getMarker(state.marker_mid());
    auto markerEnd = getMarker(state.marker_end());
    if(markerStart == nullptr && markerMid == nullptr && markerEnd == nullptr) {
        return;
    }

    Point origin;
    Point startPoint;
    Point inslopePoints[2];
    Point outslopePoints[2];

    int index = 0;
    std::array<Point, 3> points;
    PathIterator it(m_path);
    while(!it.isDone()) {
        switch(it.currentSegment(points)) {
        case PathCommand::MoveTo:
            startPoint = points[0];
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::LineTo:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::CubicTo:
            inslopePoints[0] = points[1];
            inslopePoints[1] = points[2];
            origin = points[2];
            break;
        case PathCommand::Close:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = startPoint;
            startPoint = Point();
            break;
        }

        it.next();

        if(!it.isDone() && (markerStart || markerMid)) {
            it.currentSegment(points);
            outslopePoints[0] = origin;
            outslopePoints[1] = points[0];
            if(index == 0 && markerStart) {
                auto slope = outslopePoints[1] - outslopePoints[0];
                auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
                const auto& orient = markerStart->orient();
                if(orient.orientType() == SVGAngle::OrientType::AutoStartReverse)
                    angle -= 180.f;
                positions.emplace_back(markerStart, origin, angle);
            }

            if(index > 0 && markerMid) {
                auto inslope = inslopePoints[1] - inslopePoints[0];
                auto outslope = outslopePoints[1] - outslopePoints[0];
                auto inangle = 180.f * std::atan2(inslope.y, inslope.x) / PLUTOVG_PI;
                auto outangle = 180.f * std::atan2(outslope.y, outslope.x) / PLUTOVG_PI;
                if(std::abs(inangle - outangle) > 180.f)
                    inangle += 360.f;
                auto angle = (inangle + outangle) * 0.5f;
                positions.emplace_back(markerMid, origin, angle);
            }
        }

        if(markerEnd && it.isDone()) {
            auto slope = inslopePoints[1] - inslopePoints[0];
            auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
            positions.emplace_back(markerEnd, origin, angle);
        }

        index += 1;
    }
}